

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O0

bool __thiscall zmq::ctx_t::start(ctx_t *this)

{
  int iVar1;
  bool bVar2;
  value_type __new_size;
  reference ppiVar3;
  vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> *this_00;
  int *piVar4;
  mailbox_t *__x;
  ctx_t *ctx_;
  size_type sVar5;
  long in_RDI;
  int32_t i_1;
  io_thread_t *io_thread;
  int i;
  bad_alloc *anon_var_0;
  int slot_count;
  int ios;
  int mazmq;
  int term_and_reaper_threads_count;
  value_type_conflict3 *in_stack_ffffffffffffff38;
  void *pvVar6;
  reaper_t *in_stack_ffffffffffffff40;
  value_type *in_stack_ffffffffffffff48;
  ctx_t *this_01;
  size_type in_stack_ffffffffffffff58;
  vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff70;
  vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> *local_88;
  int local_70;
  uint in_stack_ffffffffffffff94;
  uint tid_;
  ctx_t *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar7;
  reaper_t *in_stack_ffffffffffffffb0;
  
  mutex_t::lock((mutex_t *)in_stack_ffffffffffffff40);
  iVar1 = *(int *)(in_RDI + 0x278);
  mutex_t::unlock((mutex_t *)in_stack_ffffffffffffff40);
  std::vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::reserve
            ((vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> *)
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::resize
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  __new_size = (value_type)(in_RDI + 0x130);
  ppiVar3 = std::vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::operator[]
                      ((vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> *)
                       (in_RDI + 0x118),0);
  *ppiVar3 = __new_size;
  this_00 = (vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> *)
            operator_new(0xf0,(nothrow_t *)&std::nothrow);
  local_88 = (vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> *)0x0;
  if (this_00 != (vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> *)0x0) {
    reaper_t::reaper_t(in_stack_ffffffffffffffb0,
                       (ctx_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       (uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    local_88 = this_00;
  }
  *(vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> **)(in_RDI + 0xf8) = local_88;
  if (*(long *)(in_RDI + 0xf8) == 0) {
    piVar4 = __errno_location();
    *piVar4 = 0xc;
  }
  else {
    reaper_t::get_mailbox(*(reaper_t **)(in_RDI + 0xf8));
    bVar2 = mailbox_t::valid((mailbox_t *)0x1d56c2);
    if (bVar2) {
      __x = reaper_t::get_mailbox(*(reaper_t **)(in_RDI + 0xf8));
      ppiVar3 = std::vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::operator[]
                          ((vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> *)
                           (in_RDI + 0x118),1);
      *ppiVar3 = &__x->super_i_mailbox;
      reaper_t::start(in_stack_ffffffffffffff40);
      std::vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::resize
                (this_00,(size_type)__new_size,(value_type *)__x);
      iVar7 = 2;
      while( true ) {
        if (iVar7 == iVar1 + 2) {
          sVar5 = std::vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::size
                            ((vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> *)
                             (in_RDI + 0x118));
          local_70 = (int)sVar5;
          while (local_70 = local_70 + -1, iVar1 + 2 <= local_70) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          }
          *(undefined1 *)(in_RDI + 0xc0) = 0;
          return true;
        }
        ctx_ = (ctx_t *)operator_new(0xe0,(nothrow_t *)&std::nothrow);
        this_01 = (ctx_t *)0x0;
        tid_ = in_stack_ffffffffffffff94 & 0xffffff;
        if (ctx_ != (ctx_t *)0x0) {
          tid_ = CONCAT13(1,(int3)in_stack_ffffffffffffff94);
          io_thread_t::io_thread_t((io_thread_t *)in_stack_ffffffffffffffa0,ctx_,tid_);
          this_01 = ctx_;
        }
        in_stack_ffffffffffffff94 = tid_;
        if (this_01 == (ctx_t *)0x0) break;
        io_thread_t::get_mailbox((io_thread_t *)this_01);
        bVar2 = mailbox_t::valid((mailbox_t *)0x1d5815);
        if (!bVar2) {
          if (this_01 != (ctx_t *)0x0) {
            io_thread_t::~io_thread_t((io_thread_t *)in_stack_ffffffffffffff40);
            operator_delete(this_01,0xe0);
          }
          goto LAB_001d590f;
        }
        std::vector<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>::push_back
                  ((vector<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_> *)ctx_,
                   in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff40 = (reaper_t *)io_thread_t::get_mailbox((io_thread_t *)this_01);
        ppiVar3 = std::vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::operator[]
                            ((vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> *)
                             (in_RDI + 0x118),(long)iVar7);
        *ppiVar3 = (value_type)in_stack_ffffffffffffff40;
        io_thread_t::start((io_thread_t *)ctx_);
        iVar7 = iVar7 + 1;
        in_stack_ffffffffffffffa0 = this_01;
      }
      piVar4 = __errno_location();
      *piVar4 = 0xc;
    }
LAB_001d590f:
    reaper_t::stop(in_stack_ffffffffffffff40);
    pvVar6 = *(void **)(in_RDI + 0xf8);
    if (pvVar6 != (void *)0x0) {
      reaper_t::~reaper_t(in_stack_ffffffffffffff40);
      operator_delete(pvVar6,0xf0);
    }
    *(undefined8 *)(in_RDI + 0xf8) = 0;
  }
  std::vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::clear
            ((vector<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_> *)0x1d596e);
  return false;
}

Assistant:

bool zmq::ctx_t::start ()
{
    //  Initialise the array of mailboxes. Additional two slots are for
    //  zmq_ctx_term thread and reaper thread.
    _opt_sync.lock ();
    const int term_and_reaper_threads_count = 2;
    const int mazmq = _max_sockets;
    const int ios = _io_thread_count;
    _opt_sync.unlock ();
    const int slot_count = mazmq + ios + term_and_reaper_threads_count;
    try {
        _slots.reserve (slot_count);
        _empty_slots.reserve (slot_count - term_and_reaper_threads_count);
    }
    catch (const std::bad_alloc &) {
        errno = ENOMEM;
        return false;
    }
    _slots.resize (term_and_reaper_threads_count);

    //  Initialise the infrastructure for zmq_ctx_term thread.
    _slots[term_tid] = &_term_mailbox;

    //  Create the reaper thread.
    _reaper = new (std::nothrow) reaper_t (this, reaper_tid);
    if (!_reaper) {
        errno = ENOMEM;
        goto fail_cleanup_slots;
    }
    if (!_reaper->get_mailbox ()->valid ())
        goto fail_cleanup_reaper;
    _slots[reaper_tid] = _reaper->get_mailbox ();
    _reaper->start ();

    //  Create I/O thread objects and launch them.
    _slots.resize (slot_count, NULL);

    for (int i = term_and_reaper_threads_count;
         i != ios + term_and_reaper_threads_count; i++) {
        io_thread_t *io_thread = new (std::nothrow) io_thread_t (this, i);
        if (!io_thread) {
            errno = ENOMEM;
            goto fail_cleanup_reaper;
        }
        if (!io_thread->get_mailbox ()->valid ()) {
            delete io_thread;
            goto fail_cleanup_reaper;
        }
        _io_threads.push_back (io_thread);
        _slots[i] = io_thread->get_mailbox ();
        io_thread->start ();
    }

    //  In the unused part of the slot array, create a list of empty slots.
    for (int32_t i = static_cast<int32_t> (_slots.size ()) - 1;
         i >= static_cast<int32_t> (ios) + term_and_reaper_threads_count; i--) {
        _empty_slots.push_back (i);
    }

    _starting = false;
    return true;

fail_cleanup_reaper:
    _reaper->stop ();
    delete _reaper;
    _reaper = NULL;

fail_cleanup_slots:
    _slots.clear ();
    return false;
}